

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Curve25519.c
# Opt level: O2

void Hacl_EC_Point_swap_conditional_(uint64_t *a,uint64_t *b,uint64_t swap1,uint32_t ctr)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = (ulong)ctr;
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    uVar1 = b[uVar2];
    uVar3 = (uVar1 ^ a[uVar2]) & swap1;
    a[uVar2] = a[uVar2] ^ uVar3;
    b[uVar2] = uVar3 ^ uVar1;
  }
  return;
}

Assistant:

static void
Hacl_EC_Point_swap_conditional_(uint64_t *a, uint64_t *b, uint64_t swap1, uint32_t ctr)
{
  if (!(ctr == (uint32_t)0U))
  {
    Hacl_EC_Point_swap_conditional_step(a, b, swap1, ctr);
    uint32_t i = ctr - (uint32_t)1U;
    Hacl_EC_Point_swap_conditional_(a, b, swap1, i);
  }
}